

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::CopyTexture
          (DeviceContextVkImpl *this,CopyTextureAttribs *CopyAttribs)

{
  RESOURCE_STATE_TRANSITION_MODE SrcTextureTransitionMode;
  Uint32 UVar1;
  CPU_ACCESS_FLAGS CVar2;
  VkImageAspectFlags VVar3;
  VkImageAspectFlags VVar4;
  RESOURCE_STATE RVar5;
  Uint32 UVar6;
  Uint32 UVar7;
  TextureVkImpl *pTexture;
  TextureVkImpl *pTexture_00;
  TextureDesc *TexDesc;
  TextureDesc *TexDesc_00;
  uint *puVar8;
  Char *pCVar9;
  Uint64 UVar10;
  VkBuffer pVVar11;
  undefined1 local_240 [8];
  string msg_5;
  MipLevelProperties DstMipLevelAttribs;
  Uint64 DstBufferOffset;
  string msg_4;
  string msg_3;
  Box DstBox;
  MipLevelProperties SrcMipLevelAttribs;
  Uint64 SrcBufferOffset;
  string msg_2;
  string msg_1;
  undefined1 local_108 [8];
  string msg;
  anon_class_1_0_00000001 local_dd;
  VkImageAspectFlags aspectMask;
  Uint32 UStack_d8;
  anon_class_1_0_00000001 GetAspectMak;
  uint local_d4;
  Uint32 local_d0;
  undefined1 local_cc [8];
  VkImageCopy CopyRegion;
  MipLevelProperties MipLevelAttribs;
  Box FullMipBox;
  Box *pSrcBox;
  TextureDesc *DstTexDesc;
  TextureDesc *SrcTexDesc;
  TextureVkImpl *pDstTexVk;
  TextureVkImpl *pSrcTexVk;
  CopyTextureAttribs *CopyAttribs_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::CopyTexture
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,CopyAttribs);
  pTexture = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(CopyAttribs->pSrcTexture);
  pTexture_00 = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(CopyAttribs->pDstTexture);
  DeviceContextBase<Diligent::EngineVkImplTraits>::UnbindTextureFromFramebuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture,true);
  DeviceContextBase<Diligent::EngineVkImplTraits>::UnbindTextureFromFramebuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture_00,true);
  TexDesc = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                       *)pTexture);
  TexDesc_00 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
               ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          *)pTexture_00);
  FullMipBox._16_8_ = CopyAttribs->pSrcBox;
  Box::Box((Box *)&MipLevelAttribs.MipSize);
  if ((Box *)FullMipBox._16_8_ == (Box *)0x0) {
    GetMipLevelProperties
              ((MipLevelProperties *)&CopyRegion.extent.height,TexDesc,CopyAttribs->SrcMipLevel);
    MipLevelAttribs.MipSize._4_4_ = CopyRegion.extent.height;
    FullMipBox._16_8_ = &MipLevelAttribs.MipSize;
  }
  if ((TexDesc->Usage == USAGE_STAGING) || (TexDesc_00->Usage == USAGE_STAGING)) {
    if ((TexDesc->Usage == USAGE_STAGING) && (TexDesc_00->Usage != USAGE_STAGING)) {
      CVar2 = Diligent::operator&(TexDesc->CPUAccessFlags,CPU_ACCESS_FLAG_LAST);
      if (CVar2 == CPU_ACCESS_NONE) {
        FormatString<char[88]>
                  ((string *)((long)&msg_2.field_2 + 8),
                   (char (*) [88])
                   "Attempting to copy from staging texture that was not created with CPU_ACCESS_WRITE flag"
                  );
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x968);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      }
      RVar5 = TextureBase<Diligent::EngineVkImplTraits>::GetState
                        (&pTexture->super_TextureBase<Diligent::EngineVkImplTraits>);
      if (RVar5 != RESOURCE_STATE_COPY_SOURCE) {
        FormatString<char[79]>
                  ((string *)&SrcBufferOffset,
                   (char (*) [79])
                   "Source staging texture must permanently be in RESOURCE_STATE_COPY_SOURCE state")
        ;
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x969);
        std::__cxx11::string::~string((string *)&SrcBufferOffset);
      }
      UVar10 = GetStagingTextureLocationOffset
                         (TexDesc,CopyAttribs->SrcSlice,CopyAttribs->SrcMipLevel,0x10,
                          *(Uint32 *)FullMipBox._16_8_,*(Uint32 *)(FullMipBox._16_8_ + 8),
                          *(Uint32 *)(FullMipBox._16_8_ + 0x10));
      GetMipLevelProperties((MipLevelProperties *)&DstBox.MinZ,TexDesc,CopyAttribs->SrcMipLevel);
      Box::Box((Box *)((long)&msg_3.field_2 + 8));
      UVar1 = CopyAttribs->DstX;
      DstBox.MinX = CopyAttribs->DstY;
      DstBox.MinY = CopyAttribs->DstZ;
      msg_3.field_2._8_4_ = UVar1;
      UVar6 = Box::Width((Box *)FullMipBox._16_8_);
      UVar7 = DstBox.MinX;
      msg_3.field_2._12_4_ = UVar1 + UVar6;
      UVar6 = Box::Height((Box *)FullMipBox._16_8_);
      UVar1 = DstBox.MinY;
      DstBox.MaxX = UVar7 + UVar6;
      UVar7 = Box::Depth((Box *)FullMipBox._16_8_);
      DstBox.MaxY = UVar1 + UVar7;
      pVVar11 = TextureVkImpl::GetVkStagingBuffer(pTexture);
      CopyBufferToTexture(this,pVVar11,UVar10,SrcMipLevelAttribs.LogicalWidth,pTexture_00,
                          (Box *)((long)&msg_3.field_2 + 8),CopyAttribs->DstMipLevel,
                          CopyAttribs->DstSlice,CopyAttribs->DstTextureTransitionMode);
    }
    else if ((TexDesc->Usage == USAGE_STAGING) || (TexDesc_00->Usage != USAGE_STAGING)) {
      FormatString<char[100]>
                ((string *)local_240,
                 (char (*) [100])
                 "Copying data between staging textures is not supported and is likely not want you really want to do"
                );
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar9,"CopyTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x9a3);
      std::__cxx11::string::~string((string *)local_240);
    }
    else {
      CVar2 = Diligent::operator&(TexDesc_00->CPUAccessFlags,CPU_ACCESS_READ);
      if (CVar2 == CPU_ACCESS_NONE) {
        FormatString<char[85]>
                  ((string *)((long)&msg_4.field_2 + 8),
                   (char (*) [85])
                   "Attempting to copy to staging texture that was not created with CPU_ACCESS_READ flag"
                  );
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x98c);
        std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
      }
      RVar5 = TextureBase<Diligent::EngineVkImplTraits>::GetState
                        (&pTexture_00->super_TextureBase<Diligent::EngineVkImplTraits>);
      if (RVar5 != RESOURCE_STATE_COPY_DEST) {
        FormatString<char[82]>
                  ((string *)&DstBufferOffset,
                   (char (*) [82])
                   "Destination staging texture must permanently be in RESOURCE_STATE_COPY_DEST state"
                  );
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x98d);
        std::__cxx11::string::~string((string *)&DstBufferOffset);
      }
      UVar10 = GetStagingTextureLocationOffset
                         (TexDesc_00,CopyAttribs->DstSlice,CopyAttribs->DstMipLevel,0x10,
                          CopyAttribs->DstX,CopyAttribs->DstY,CopyAttribs->DstZ);
      GetMipLevelProperties
                ((MipLevelProperties *)((long)&msg_5.field_2 + 8),TexDesc_00,
                 CopyAttribs->DstMipLevel);
      UVar1 = CopyAttribs->SrcMipLevel;
      UVar7 = CopyAttribs->SrcSlice;
      SrcTextureTransitionMode = CopyAttribs->SrcTextureTransitionMode;
      pVVar11 = TextureVkImpl::GetVkStagingBuffer(pTexture_00);
      CopyTextureToBuffer(this,pTexture,(Box *)FullMipBox._16_8_,UVar1,UVar7,
                          SrcTextureTransitionMode,pVVar11,UVar10,DstMipLevelAttribs.LogicalWidth);
    }
  }
  else {
    memset(local_cc,0,0x44);
    CopyRegion.srcSubresource.baseArrayLayer = *(uint32_t *)FullMipBox._16_8_;
    CopyRegion.srcSubresource.layerCount = *(uint32_t *)(FullMipBox._16_8_ + 8);
    CopyRegion.srcOffset.x = *(int32_t *)(FullMipBox._16_8_ + 0x10);
    CopyRegion.dstOffset.y = Box::Width((Box *)FullMipBox._16_8_);
    local_d0 = Box::Height((Box *)FullMipBox._16_8_);
    local_d4 = 1;
    puVar8 = std::max<unsigned_int>(&local_d0,&local_d4);
    CopyRegion.dstOffset.z = *puVar8;
    UStack_d8 = Box::Depth((Box *)FullMipBox._16_8_);
    aspectMask = 1;
    puVar8 = std::max<unsigned_int>(&stack0xffffffffffffff28,&aspectMask);
    CopyRegion.extent.width = *puVar8;
    VVar3 = CopyTexture::anon_class_1_0_00000001::operator()(&local_dd,TexDesc->Format);
    msg.field_2._12_4_ = VVar3;
    VVar4 = CopyTexture::anon_class_1_0_00000001::operator()(&local_dd,TexDesc_00->Format);
    if (VVar3 != VVar4) {
      FormatString<char[62]>
                ((string *)local_108,
                 (char (*) [62])"Vulkan spec requires that dst and src aspect masks must match");
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar9,"CopyTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x954);
      std::__cxx11::string::~string((string *)local_108);
    }
    CopyRegion.srcSubresource.aspectMask = CopyAttribs->SrcSlice;
    CopyRegion.srcSubresource.mipLevel = 1;
    local_cc._4_4_ = CopyAttribs->SrcMipLevel;
    local_cc._0_4_ = msg.field_2._12_4_;
    CopyRegion.dstSubresource.aspectMask = CopyAttribs->DstSlice;
    CopyRegion.dstSubresource.mipLevel = 1;
    CopyRegion.srcOffset.z = CopyAttribs->DstMipLevel;
    CopyRegion.srcOffset.y = msg.field_2._12_4_;
    CopyRegion.dstSubresource.baseArrayLayer = CopyAttribs->DstX;
    CopyRegion.dstSubresource.layerCount = CopyAttribs->DstY;
    CopyRegion.dstOffset.x = CopyAttribs->DstZ;
    CopyTextureRegion(this,pTexture,CopyAttribs->SrcTextureTransitionMode,pTexture_00,
                      CopyAttribs->DstTextureTransitionMode,(VkImageCopy *)local_cc);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CopyTexture(const CopyTextureAttribs& CopyAttribs)
{
    TDeviceContextBase::CopyTexture(CopyAttribs);

    TextureVkImpl* pSrcTexVk = ClassPtrCast<TextureVkImpl>(CopyAttribs.pSrcTexture);
    TextureVkImpl* pDstTexVk = ClassPtrCast<TextureVkImpl>(CopyAttribs.pDstTexture);

    // We must unbind the textures from framebuffer because
    // we will transition their states. If we later try to commit
    // them as render targets (e.g. from SetPipelineState()), a
    // state mismatch error will occur.
    UnbindTextureFromFramebuffer(pSrcTexVk, true);
    UnbindTextureFromFramebuffer(pDstTexVk, true);

    const TextureDesc& SrcTexDesc = pSrcTexVk->GetDesc();
    const TextureDesc& DstTexDesc = pDstTexVk->GetDesc();
    const Box*         pSrcBox    = CopyAttribs.pSrcBox;
    Box                FullMipBox;
    if (pSrcBox == nullptr)
    {
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(SrcTexDesc, CopyAttribs.SrcMipLevel);

        FullMipBox.MaxX = MipLevelAttribs.LogicalWidth;
        FullMipBox.MaxY = MipLevelAttribs.LogicalHeight;
        FullMipBox.MaxZ = MipLevelAttribs.Depth;
        pSrcBox         = &FullMipBox;
    }

    if (SrcTexDesc.Usage != USAGE_STAGING && DstTexDesc.Usage != USAGE_STAGING)
    {
        VkImageCopy CopyRegion = {};

        CopyRegion.srcOffset.x   = pSrcBox->MinX;
        CopyRegion.srcOffset.y   = pSrcBox->MinY;
        CopyRegion.srcOffset.z   = pSrcBox->MinZ;
        CopyRegion.extent.width  = pSrcBox->Width();
        CopyRegion.extent.height = std::max(pSrcBox->Height(), 1u);
        CopyRegion.extent.depth  = std::max(pSrcBox->Depth(), 1u);

        auto GetAspectMak = [](TEXTURE_FORMAT Format) -> VkImageAspectFlags {
            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Format);
            return ComponentTypeToVkAspectMask(FmtAttribs.ComponentType);
        };
        VkImageAspectFlags aspectMask = GetAspectMak(SrcTexDesc.Format);
        DEV_CHECK_ERR(aspectMask == GetAspectMak(DstTexDesc.Format), "Vulkan spec requires that dst and src aspect masks must match");

        CopyRegion.srcSubresource.baseArrayLayer = CopyAttribs.SrcSlice;
        CopyRegion.srcSubresource.layerCount     = 1;
        CopyRegion.srcSubresource.mipLevel       = CopyAttribs.SrcMipLevel;
        CopyRegion.srcSubresource.aspectMask     = aspectMask;

        CopyRegion.dstSubresource.baseArrayLayer = CopyAttribs.DstSlice;
        CopyRegion.dstSubresource.layerCount     = 1;
        CopyRegion.dstSubresource.mipLevel       = CopyAttribs.DstMipLevel;
        CopyRegion.dstSubresource.aspectMask     = aspectMask;

        CopyRegion.dstOffset.x = CopyAttribs.DstX;
        CopyRegion.dstOffset.y = CopyAttribs.DstY;
        CopyRegion.dstOffset.z = CopyAttribs.DstZ;

        CopyTextureRegion(pSrcTexVk, CopyAttribs.SrcTextureTransitionMode, pDstTexVk, CopyAttribs.DstTextureTransitionMode, CopyRegion);
    }
    else if (SrcTexDesc.Usage == USAGE_STAGING && DstTexDesc.Usage != USAGE_STAGING)
    {
        DEV_CHECK_ERR((SrcTexDesc.CPUAccessFlags & CPU_ACCESS_WRITE), "Attempting to copy from staging texture that was not created with CPU_ACCESS_WRITE flag");
        DEV_CHECK_ERR(pSrcTexVk->GetState() == RESOURCE_STATE_COPY_SOURCE, "Source staging texture must permanently be in RESOURCE_STATE_COPY_SOURCE state");

        // address of (x,y,z) = region->bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)

        // bufferOffset must be a multiple of 4 (18.4)
        // If the calling command's VkImage parameter is a compressed image, bufferOffset
        // must be a multiple of the compressed texel block size in bytes (18.4). This
        // is automatically guaranteed as MipWidth and MipHeight are rounded to block size.

        const Uint64 SrcBufferOffset =
            GetStagingTextureLocationOffset(SrcTexDesc, CopyAttribs.SrcSlice, CopyAttribs.SrcMipLevel,
                                            TextureVkImpl::StagingBufferOffsetAlignment,
                                            pSrcBox->MinX, pSrcBox->MinY, pSrcBox->MinZ);
        const MipLevelProperties SrcMipLevelAttribs = GetMipLevelProperties(SrcTexDesc, CopyAttribs.SrcMipLevel);

        Box DstBox;
        DstBox.MinX = CopyAttribs.DstX;
        DstBox.MinY = CopyAttribs.DstY;
        DstBox.MinZ = CopyAttribs.DstZ;
        DstBox.MaxX = DstBox.MinX + pSrcBox->Width();
        DstBox.MaxY = DstBox.MinY + pSrcBox->Height();
        DstBox.MaxZ = DstBox.MinZ + pSrcBox->Depth();

        CopyBufferToTexture(
            pSrcTexVk->GetVkStagingBuffer(),
            SrcBufferOffset,
            SrcMipLevelAttribs.StorageWidth, // GetStagingTextureLocationOffset assumes texels are tightly packed
            *pDstTexVk,
            DstBox,
            CopyAttribs.DstMipLevel,
            CopyAttribs.DstSlice,
            CopyAttribs.DstTextureTransitionMode);
    }
    else if (SrcTexDesc.Usage != USAGE_STAGING && DstTexDesc.Usage == USAGE_STAGING)
    {
        DEV_CHECK_ERR((DstTexDesc.CPUAccessFlags & CPU_ACCESS_READ), "Attempting to copy to staging texture that was not created with CPU_ACCESS_READ flag");
        DEV_CHECK_ERR(pDstTexVk->GetState() == RESOURCE_STATE_COPY_DEST, "Destination staging texture must permanently be in RESOURCE_STATE_COPY_DEST state");

        // address of (x,y,z) = region->bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)
        const Uint64 DstBufferOffset =
            GetStagingTextureLocationOffset(DstTexDesc, CopyAttribs.DstSlice, CopyAttribs.DstMipLevel,
                                            TextureVkImpl::StagingBufferOffsetAlignment,
                                            CopyAttribs.DstX, CopyAttribs.DstY, CopyAttribs.DstZ);
        const MipLevelProperties DstMipLevelAttribs = GetMipLevelProperties(DstTexDesc, CopyAttribs.DstMipLevel);

        CopyTextureToBuffer(
            *pSrcTexVk,
            *pSrcBox,
            CopyAttribs.SrcMipLevel,
            CopyAttribs.SrcSlice,
            CopyAttribs.SrcTextureTransitionMode,
            pDstTexVk->GetVkStagingBuffer(),
            DstBufferOffset,
            DstMipLevelAttribs.StorageWidth // GetStagingTextureLocationOffset assumes texels are tightly packed
        );
    }
    else
    {
        UNSUPPORTED("Copying data between staging textures is not supported and is likely not want you really want to do");
    }
}